

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawBar::ParseComparator(CommandDrawBar *this,FScanner *sc)

{
  bool bVar1;
  bool bVar2;
  PClassActor *pPVar3;
  bool extendedSyntax;
  FScanner *sc_local;
  CommandDrawBar *this_local;
  
  bVar1 = FScanner::CheckToken(sc,0x28);
  bVar2 = FScanner::CheckToken(sc,0x101);
  if ((bVar2) || ((bVar1 && (bVar2 = FScanner::CheckToken(sc,0x102), bVar2)))) {
    pPVar3 = PClass::FindActor(sc->String);
    (this->data).field_1.inventoryItem = pPVar3;
    if (((this->data).field_1.inventoryItem == (PClassActor *)0x0) ||
       (bVar2 = PClass::IsAncestorOf
                          (AInventory::RegistrationInfo.MyClass,
                           &((this->data).field_1.inventoryItem)->super_PClass), !bVar2)) {
      FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
      (this->data).field_1.inventoryItem = (PClassActor *)AInventory::RegistrationInfo.MyClass;
    }
  }
  else if ((bVar1) && (bVar2 = FScanner::CheckToken(sc,0x104), bVar2)) {
    (this->data).useMaximumConstant = true;
    (this->data).field_1.value = sc->Number;
  }
  if (bVar1) {
    FScanner::MustGetToken(sc,0x29);
  }
  return;
}

Assistant:

void	ParseComparator(FScanner &sc)
		{
			bool extendedSyntax = sc.CheckToken('(');

			if(sc.CheckToken(TK_Identifier) || (extendedSyntax && sc.CheckToken(TK_StringConst))) //comparing reference
			{
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(data.inventoryItem)) //must be a kind of inventory
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AInventory);
				}
			}
			else if(extendedSyntax && sc.CheckToken(TK_IntConst))
			{
				data.useMaximumConstant = true;
				data.value = sc.Number;
			}

			if(extendedSyntax)
				sc.MustGetToken(')');
		}